

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O2

bool __thiscall
ON_SubD::Internal_GetGeometryControlNetMesh
          (ON_SubD *this,ON_SubDLevel *level,ON_SubDLevelComponentIdIterator *vit_by_id,
          ON_SubDLevelComponentIdIterator *fit_by_id,ON_Mesh *mesh)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  ON_SubDFace **ppOVar15;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_SubDVertex *pOVar16;
  ON_3dPoint *this_01;
  bool *pbVar17;
  ON_SubDFace *pOVar18;
  double *subdivision_point;
  VertexToDuplicate *pVVar19;
  ON_SubDEdge *this_02;
  uint *puVar20;
  ulong uVar21;
  uint uVar22;
  uint mesh_D_count0;
  uint efi;
  uint uVar23;
  uint uVar24;
  ON_SubDLevelComponentIdIterator *pOVar25;
  ON_SubDLevelComponentIdIterator *pOVar26;
  void **ppvVar27;
  ON_MeshFace *pOVar28;
  unsigned_short fvi;
  uint uVar29;
  ulong uVar30;
  ON_SubDLevel *pOVar31;
  ON_SubDLevel *pOVar32;
  long lVar33;
  Type *pTVar34;
  bool local_199;
  ON_SimpleArray<ON_3dPoint> *local_198;
  ulong local_190;
  VertexToDuplicate local_188;
  ON_SubDLevel *local_168;
  ON_SubDLevelComponentIdIterator *local_160;
  uint local_154;
  ulong local_150;
  ON_SubDLevel *local_148;
  VertexToDuplicate *local_140;
  uint local_134;
  ON_SimpleArray<VertexToDuplicate> dups_array;
  VertexToDuplicate dup;
  ulong local_f0;
  ON_2udex ngon_span;
  ON_SimpleArray<ON_2udex> ngon_spans;
  ON_SimpleArray<bool> mesh_VertexNeedsDuplicated;
  ON_3dPoint center_point;
  
  dup.m_sector_id = 0;
  dup.m_mesh_V_index = 0;
  dup.m_mesh_F_index = 0;
  dup.m_vertex = (ON_SubDVertex *)0x0;
  dup.m_face._0_4_ = 0;
  dup.m_face._4_4_ = 0;
  dups_array._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0082c498;
  dups_array.m_a = (VertexToDuplicate *)0x0;
  dups_array.m_count = 0;
  dups_array.m_capacity = 0;
  uVar3 = level->m_vertex_count;
  ppOVar15 = level->m_face;
  local_f0 = 0;
  uVar23 = 0;
  uVar29 = 0;
  while( true ) {
    pOVar18 = *ppOVar15;
    uVar22 = (uint)local_f0;
    if (pOVar18 == (ON_SubDFace *)0x0) break;
    uVar12 = pOVar18->m_edge_count;
    if (1 < uVar12) {
      if (uVar12 < 5) {
        uVar23 = uVar23 + 1;
      }
      else {
        uVar29 = uVar29 + 1;
        uVar23 = uVar23 + uVar12;
        if (uVar22 <= uVar12) {
          local_f0 = (ulong)(uint)uVar12;
        }
      }
    }
    ppOVar15 = &pOVar18->m_next_face;
  }
  local_168 = level;
  local_160 = fit_by_id;
  if ((uVar3 < 3) || (uVar23 == 0)) {
    ON_SubDIncrementErrorCount();
    bVar11 = false;
    goto LAB_00626059;
  }
  this_00 = &ON_Mesh::DoublePrecisionVertices(mesh)->super_ON_SimpleArray<ON_3dPoint>;
  ON_SimpleArray<ON_3dPoint>::Reserve(this_00,(ulong)(uVar29 + uVar3));
  if (-1 < this_00->m_capacity) {
    this_00->m_count = 0;
  }
  local_198 = this_00;
  ON_SimpleArray<bool>::ON_SimpleArray(&mesh_VertexNeedsDuplicated,(ulong)(uVar29 + uVar3));
  local_148 = (ON_SubDLevel *)&mesh->m_F;
  ON_SimpleArray<ON_MeshFace>::Reserve((ON_SimpleArray<ON_MeshFace> *)local_148,(ulong)uVar23);
  if (-1 < (mesh->m_F).m_capacity) {
    (mesh->m_F).m_count = 0;
  }
  ON_SimpleArray<ON_2udex>::ON_SimpleArray(&ngon_spans,(ulong)uVar29);
  pOVar16 = ON_SubDLevelComponentIdIterator::FirstVertex(vit_by_id);
  while (pOVar16 != (ON_SubDVertex *)0x0) {
    uVar23 = (pOVar16->super_ON_SubDComponentBase).m_archive_id;
    uVar13 = local_198->m_count;
    if ((uVar3 <= uVar23 - 1) || (uVar13 + 1 != uVar23)) goto LAB_00625c7d;
    this_01 = ON_SimpleArray<ON_3dPoint>::AppendNew(local_198);
    ON_3dPoint::operator=(this_01,pOVar16->m_P);
    bVar11 = VertexToDuplicate::NeedsDuplicated(pOVar16);
    pbVar17 = ON_SimpleArray<bool>::AppendNew(&mesh_VertexNeedsDuplicated);
    *pbVar17 = bVar11;
    pOVar16 = ON_SubDLevelComponentIdIterator::NextVertex(vit_by_id);
  }
  uVar13 = local_198->m_count;
LAB_00625c7d:
  bVar11 = true;
  if (uVar13 == uVar3) {
    ON_SimpleArray<ON_2udex>::Reserve(&ngon_spans,(ulong)uVar29);
    pOVar18 = ON_SubDLevelComponentIdIterator::FirstFace(local_160);
    while (uVar9 = dup.m_face._4_4_, uVar7 = dup.m_face._0_4_, pOVar18 != (ON_SubDFace *)0x0) {
      local_188.m_vertex = (ON_SubDVertex *)0x0;
      local_188.m_face._0_4_ = 0;
      local_188.m_face._4_4_ = 0;
      uVar12 = pOVar18->m_edge_count;
      dup.m_face._0_4_ = SUB84(pOVar18,0);
      uVar8 = dup.m_face._0_4_;
      dup.m_face._4_4_ = (undefined4)((ulong)pOVar18 >> 0x20);
      uVar10 = dup.m_face._4_4_;
      dup.m_face._0_4_ = uVar7;
      dup.m_face._4_4_ = uVar9;
      if (uVar12 < 5) {
        if (2 < uVar12) {
          for (uVar30 = 0; uVar30 < uVar12; uVar30 = uVar30 + 1) {
            pOVar16 = ON_SubDFace::Vertex(pOVar18,(uint)uVar30);
            if (pOVar16 == (ON_SubDVertex *)0x0) {
              uVar23 = 0;
            }
            else {
              uVar23 = (pOVar16->super_ON_SubDComponentBase).m_archive_id;
            }
            *(uint *)((long)&local_188.m_vertex + uVar30 * 4) = uVar23;
            if (((int)uVar23 < 1) || ((int)uVar3 < (int)uVar23)) goto LAB_00625fea;
            uVar23 = uVar23 - 1;
            *(uint *)((long)&local_188.m_vertex + uVar30 * 4) = uVar23;
            if (mesh_VertexNeedsDuplicated.m_a[uVar23] == true) {
              dup.m_mesh_F_index = (mesh->m_F).m_count;
              dup.m_mesh_V_index = uVar23;
              dup.m_vertex = pOVar16;
              dup.m_face._0_4_ = uVar8;
              dup.m_face._4_4_ = uVar10;
              ON_SimpleArray<VertexToDuplicate>::Append(&dups_array,&dup);
            }
            uVar12 = pOVar18->m_edge_count;
          }
          if ((int)local_188.m_vertex != -1) {
            if (uVar12 == 3) {
              local_188.m_face._4_4_ = (int)local_188.m_face;
            }
            ON_SimpleArray<ON_MeshFace>::Append
                      ((ON_SimpleArray<ON_MeshFace> *)local_148,(ON_MeshFace *)&local_188);
          }
        }
      }
      else {
        subdivision_point = ON_3dPoint::operator_cast_to_double_(&center_point);
        bVar11 = ON_SubDFace::GetSubdivisionPoint(pOVar18,subdivision_point);
        if (bVar11) {
          ON_2udex::ON_2udex(&ngon_span,(mesh->m_F).m_count,0);
          iVar6 = dups_array.m_count;
          iVar14 = local_198->m_count;
          iVar4 = (mesh->m_F).m_count;
          local_188.m_face._0_4_ = iVar14;
          local_188.m_face._4_4_ = iVar14;
          pOVar16 = ON_SubDFace::Vertex(pOVar18,0);
          if (pOVar16 == (ON_SubDVertex *)0x0) {
            uVar23 = 0;
          }
          else {
            uVar23 = (pOVar16->super_ON_SubDComponentBase).m_archive_id;
          }
          if ((int)uVar23 <= (int)uVar3 && 0 < (int)uVar23) {
            uVar23 = uVar23 - 1;
            local_188.m_vertex = (ON_SubDVertex *)CONCAT44(uVar23,(int)local_188.m_vertex);
            if (mesh_VertexNeedsDuplicated.m_a[uVar23] == true) {
              dup.m_mesh_F_index = (mesh->m_F).m_count;
              dup.m_mesh_V_index = uVar23;
              dup.m_vertex = pOVar16;
              dup.m_face._0_4_ = uVar8;
              dup.m_face._4_4_ = uVar10;
              ON_SimpleArray<VertexToDuplicate>::Append(&dups_array,&dup);
            }
            local_199 = false;
            ON_SimpleArray<bool>::Append(&mesh_VertexNeedsDuplicated,&local_199);
            ON_SimpleArray<ON_3dPoint>::Append(local_198,&center_point);
            for (uVar12 = 1; uVar12 <= pOVar18->m_edge_count; uVar12 = uVar12 + 1) {
              local_188.m_vertex =
                   (ON_SubDVertex *)CONCAT44(local_188.m_vertex._4_4_,local_188.m_vertex._4_4_);
              pOVar16 = ON_SubDFace::Vertex(pOVar18,(uint)uVar12 % (uint)pOVar18->m_edge_count);
              if (pOVar16 == (ON_SubDVertex *)0x0) {
                uVar23 = 0;
              }
              else {
                uVar23 = (pOVar16->super_ON_SubDComponentBase).m_archive_id;
              }
              if (((int)uVar23 < 1) || ((int)uVar3 < (int)uVar23)) {
                local_188.m_vertex = (ON_SubDVertex *)CONCAT44(uVar23,0xffffffff);
                bVar11 = true;
                goto LAB_00625f52;
              }
              uVar23 = uVar23 - 1;
              local_188.m_vertex = (ON_SubDVertex *)CONCAT44(uVar23,(int)local_188.m_vertex);
              if ((uVar12 < pOVar18->m_edge_count) &&
                 (mesh_VertexNeedsDuplicated.m_a[uVar23] == true)) {
                dup.m_mesh_F_index = (mesh->m_F).m_count;
                dup.m_mesh_V_index = uVar23;
                dup.m_vertex = pOVar16;
                dup.m_face._0_4_ = uVar8;
                dup.m_face._4_4_ = uVar10;
                ON_SimpleArray<VertexToDuplicate>::Append(&dups_array,&dup);
              }
              ON_SimpleArray<ON_MeshFace>::Append
                        ((ON_SimpleArray<ON_MeshFace> *)local_148,(ON_MeshFace *)&local_188);
            }
            bVar11 = (int)local_188.m_vertex == -1;
LAB_00625f52:
            ngon_span.j = (mesh->m_F).m_count;
            if (!bVar11) {
              uVar29 = ngon_span.j - ngon_span.i;
              uVar23 = ON_SubDFace::EdgeCount(pOVar18);
              if (uVar29 == uVar23) {
                ngon_span.j = (mesh->m_F).m_count;
                if (2 < uVar29) {
                  ON_SimpleArray<ON_2udex>::Append(&ngon_spans,&ngon_span);
                }
                goto LAB_00625fea;
              }
            }
            if ((-1 < iVar14) && (iVar14 <= local_198->m_capacity)) {
              local_198->m_count = iVar14;
            }
            if ((-1 < iVar4) && (iVar4 <= (mesh->m_F).m_capacity)) {
              (mesh->m_F).m_count = iVar4;
            }
            if ((-1 < iVar6) && (iVar6 <= dups_array.m_capacity)) {
              dups_array._16_8_ = CONCAT44(dups_array.m_capacity,iVar6);
            }
          }
        }
      }
LAB_00625fea:
      pOVar18 = ON_SubDLevelComponentIdIterator::NextFace(local_160);
    }
    bVar11 = (mesh->m_F).m_count == 0;
  }
  ON_SubDLevel::ClearArchiveId(local_168);
  if (bVar11) {
LAB_00626038:
    ON_SubDIncrementErrorCount();
    bVar11 = false;
  }
  else {
    uVar3 = local_198->m_count;
    uVar23 = (mesh->m_F).m_count;
    if (uVar23 == 0 || uVar3 < 3) goto LAB_00626038;
    local_148 = (ON_SubDLevel *)(dups_array._16_8_ & 0xffffffff);
    if ((ON_SubDLevel *)0x1 < local_148) {
      local_134 = uVar23;
      ON_SimpleArray<VertexToDuplicate>::QuickSortAndRemoveDuplicates
                (&dups_array,VertexToDuplicate::CompareVertexIdAndFaceId);
      center_point.z = 0.0;
      center_point.x = 0.0;
      center_point.y = 0.0;
      pOVar31 = (ON_SubDLevel *)0x0;
      pOVar25 = (ON_SubDLevelComponentIdIterator *)dups_array.m_a;
      if (dups_array.m_count < 1) {
        pOVar25 = (ON_SubDLevelComponentIdIterator *)0x0;
      }
      local_154 = 0;
      pOVar26 = pOVar25;
      local_160 = pOVar25;
LAB_00626123:
      do {
        uVar23 = (uint)pOVar31;
        if ((uint)local_148 <= uVar23) break;
        pOVar32 = (ON_SubDLevel *)((ulong)pOVar31 & 0xffffffff);
        lVar33 = (long)pOVar32 * 0x20;
        pOVar16 = *(ON_SubDVertex **)(&pOVar26->m_bLevelLinkedListIncreasingId + lVar33);
        puVar1 = (undefined8 *)((long)&pOVar26->m_first + lVar33 + 4);
        uVar5 = *puVar1;
        local_188._20_8_ = puVar1[1];
        local_188.m_face._0_4_ =
             (int)*(ON_SubDComponentBaseLink **)
                   (&pOVar26->m_bLevelLinkedListIncreasingId + lVar33 + 8);
        local_188.m_face._4_4_ = (int)uVar5;
        local_188.m_sector_id = (uint)((ulong)uVar5 >> 0x20);
        local_188.m_vertex = pOVar16;
        local_168 = pOVar32;
        if (pOVar16 == (ON_SubDVertex *)0x0) {
LAB_006264f2:
          ON_SubDIncrementErrorCount();
          break;
        }
        local_140 = (VertexToDuplicate *)(&local_160->m_bLevelLinkedListIncreasingId + lVar33);
        local_190 = CONCAT44(local_190._4_4_,uVar23 + 1);
        uVar29 = local_188.m_mesh_V_index;
        uVar30 = local_188._20_8_ & 0xffffffff;
        pVVar19 = (VertexToDuplicate *)(&pOVar25->m_cidit + (long)pOVar32);
        while (pOVar32 = (ON_SubDLevel *)((long)&pOVar32->m_level_index + 1), pOVar31 = local_148,
              pOVar32 < local_148) {
          iVar14 = VertexToDuplicate::CompareVertexId(&local_188,pVVar19);
          pOVar31 = pOVar32;
          if (iVar14 < 0) break;
          if ((((iVar14 != 0) || (pOVar16 != pVVar19->m_vertex)) || (uVar3 <= uVar29)) ||
             (puVar20 = &pVVar19->m_mesh_V_index, pVVar19 = pVVar19 + 1, uVar29 != *puVar20))
          goto LAB_006264f2;
        }
        pOVar26 = local_160;
        if ((int)pOVar31 != (uint)local_190) {
          ngon_span.i = *(uint *)&local_198->m_a[uVar30].x;
          ngon_span.j = *(uint *)((long)&local_198->m_a[uVar30].x + 4);
          local_190 = (ulong)((int)pOVar31 - uVar23);
          local_150 = local_150 & 0xffffffff00000000;
          for (uVar30 = 0; uVar30 != local_190; uVar30 = uVar30 + 1) {
            if (local_140[uVar30].m_sector_id == 0) {
              pOVar16 = ON_SubDSectorIterator::Initialize
                                  ((ON_SubDSectorIterator *)&center_point,local_140[uVar30].m_face,0
                                   ,local_188.m_vertex);
              local_154 = local_154 + 1;
              if ((pOVar16 != (ON_SubDVertex *)0x0) &&
                 (pOVar18 = ON_SubDSectorIterator::IncrementToCrease
                                      ((ON_SubDSectorIterator *)&center_point,-1),
                 pOVar18 != (ON_SubDFace *)0x0)) {
                local_150 = CONCAT44(local_150._4_4_,(int)local_150 + 1);
                if ((uVar30 != 0) || (bVar11 = ON_SubDVertex::IsDart(local_188.m_vertex), !bVar11))
                {
                  pOVar18 = ON_SubDSectorIterator::CurrentFace
                                      ((ON_SubDSectorIterator *)&center_point);
                  while( true ) {
                    local_188.m_face._0_4_ = (int)pOVar18;
                    local_188.m_face._4_4_ = (int)((ulong)pOVar18 >> 0x20);
                    if (pOVar18 == (ON_SubDFace *)0x0) break;
                    pVVar19 = Internal_FindMatchingVertexIdAndFaceId
                                        (&local_188,local_140,(uint)local_190);
                    if (pVVar19 == (VertexToDuplicate *)0x0) goto LAB_006263c6;
                    pVVar19->m_sector_id = local_154;
                    pOVar18 = ON_SubDSectorIterator::NextFace
                                        ((ON_SubDSectorIterator *)&center_point,AnyCrease);
                  }
                  if ((int)local_150 != 0) goto LAB_006262e8;
                  goto LAB_00626123;
                }
                this_02 = ON_SubDSectorIterator::CurrentEdge
                                    ((ON_SubDSectorIterator *)&center_point,0);
                if (((this_02 != (ON_SubDEdge *)0x0) &&
                    (bVar11 = ON_SubDEdge::IsCrease(this_02), bVar11)) &&
                   (this_02->m_face_count == 2)) {
                  uVar23 = 0;
                  goto LAB_00626324;
                }
              }
LAB_006263c6:
              ON_SubDIncrementErrorCount();
              goto LAB_00626123;
            }
LAB_006262e8:
          }
          goto LAB_006263d5;
        }
      } while( true );
    }
    bVar11 = true;
    if ((ngon_spans.m_count != 0) && (2 < uVar22)) {
      center_point.x = (double)&PTR__ON_SimpleArray_0081fa28;
      center_point.y = 0.0;
      center_point.z = 0.0;
      puVar20 = ON_SimpleArray<unsigned_int>::Reserve
                          ((ON_SimpleArray<unsigned_int> *)&center_point,(ulong)(uVar22 * 2));
      for (uVar30 = 0; uVar30 < (uint)ngon_spans.m_count; uVar30 = uVar30 + 1) {
        uVar3 = ngon_spans.m_a[uVar30].i;
        uVar21 = (ulong)uVar3;
        uVar23 = ngon_spans.m_a[uVar30].j;
        if (2 < uVar23 - uVar3) {
          *puVar20 = uVar3;
          pOVar28 = (mesh->m_F).m_a;
          *puVar20 = pOVar28[uVar21].vi[0];
          pOVar28 = pOVar28 + uVar21;
          lVar33 = 0;
          for (; uVar21 < uVar23; uVar21 = uVar21 + 1) {
            puVar20[lVar33] = (uint)uVar21;
            (puVar20 + local_f0)[lVar33] = pOVar28->vi[0];
            lVar33 = lVar33 + 1;
            pOVar28 = pOVar28 + 1;
          }
          ON_Mesh::AddNgon(mesh,(uint)lVar33,puVar20 + local_f0,(uint)lVar33,puVar20);
        }
      }
      ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&center_point);
    }
  }
  ON_SimpleArray<ON_2udex>::~ON_SimpleArray(&ngon_spans);
  ON_SimpleArray<bool>::~ON_SimpleArray(&mesh_VertexNeedsDuplicated);
LAB_00626059:
  ON_SimpleArray<VertexToDuplicate>::~ON_SimpleArray(&dups_array);
  return bVar11;
  while( true ) {
    pVVar19->m_mesh_V_index = local_198->m_count;
    ON_SimpleArray<ON_3dPoint>::Append(local_198,(ON_3dPoint *)&ngon_span);
    bVar11 = Internal_UpdateMeshFaceVertexIndex
                       (mesh,pVVar19->m_mesh_F_index,local_134,uVar29,pVVar19->m_mesh_V_index);
    uVar23 = uVar23 + 1;
    if (!bVar11) break;
LAB_00626324:
    if (uVar23 == 2) goto LAB_00626398;
    pOVar18 = ON_SubDEdge::Face(this_02,uVar23);
    local_188.m_face._0_4_ = (int)pOVar18;
    local_188.m_face._4_4_ = (int)((ulong)pOVar18 >> 0x20);
    pVVar19 = Internal_FindMatchingVertexIdAndFaceId(&local_188,local_140,(uint)local_190);
    if (pVVar19 == (VertexToDuplicate *)0x0) break;
  }
  local_150 = local_150 & 0xffffffff00000000;
  ON_SubDIncrementErrorCount();
LAB_00626398:
  for (lVar33 = 0; pOVar26 = local_160, local_190 << 5 != lVar33; lVar33 = lVar33 + 0x20) {
    *(uint *)((long)&pOVar25->m_current + lVar33 + (long)local_168 * 0x20) = local_154;
  }
LAB_006263d5:
  if ((int)local_150 != 0) {
    if ((int)local_150 != 1) {
      ON_qsort(local_140,local_190,0x20,VertexToDuplicate::CompareSectorIdAndFaceId);
    }
    pOVar32 = local_168;
    local_168 = (ON_SubDLevel *)(&pOVar25->m_count + (long)local_168 * 8);
    uVar23 = 0;
    while (pOVar26 = local_160, uVar23 < (uint)local_190) {
      uVar21 = (ulong)uVar23;
      local_188.m_vertex = local_140[uVar21].m_vertex;
      pOVar18 = local_140[uVar21].m_face;
      puVar1 = (undefined8 *)((long)&local_140[uVar21].m_face + 4);
      local_188._20_8_ = puVar1[1];
      local_188.m_sector_id = (uint)((ulong)*puVar1 >> 0x20);
      local_188.m_face._0_4_ = (int)pOVar18;
      local_188.m_face._4_4_ = (int)((ulong)pOVar18 >> 0x20);
      ppvVar27 = &(&pOVar25->m_cidit)[(long)pOVar32->m_vertex + (uVar21 - 8)].
                  super_ON_FixedSizePoolIterator.m_it_element;
      uVar30 = uVar21;
      uVar13 = uVar23;
      do {
        uVar30 = uVar30 + 1;
        uVar24 = (uint)local_190;
        if (local_190 <= uVar30) break;
        uVar24 = uVar13 + 1;
        uVar2 = *(uint *)ppvVar27;
        ppvVar27 = ppvVar27 + 4;
        uVar13 = uVar24;
      } while (local_188.m_sector_id == uVar2);
      bVar11 = uVar23 != 0;
      uVar23 = uVar24;
      if (bVar11) {
        local_188.m_mesh_F_index = (uint)((ulong)local_188._20_8_ >> 0x20);
        local_188.m_mesh_V_index = local_198->m_count;
        ON_SimpleArray<ON_3dPoint>::Append(local_198,(ON_3dPoint *)&ngon_span);
        local_150 = (ulong)uVar24;
        pTVar34 = &((ON_SubDComponentIdIterator *)local_168->m_vertex)[uVar21 - 1].m_component_type;
        for (; uVar21 < local_150; uVar21 = uVar21 + 1) {
          Internal_UpdateMeshFaceVertexIndex
                    (mesh,*(uint *)pTVar34,local_134,uVar29,local_188.m_mesh_V_index);
          pTVar34 = pTVar34 + 0x20;
        }
      }
    }
  }
  goto LAB_00626123;
}

Assistant:

bool ON_SubD::Internal_GetGeometryControlNetMesh(
  const ON_SubDLevel& level,
  ON_SubDLevelComponentIdIterator& vit_by_id,
  ON_SubDLevelComponentIdIterator& fit_by_id,
  ON_Mesh& mesh
) const
{
  VertexToDuplicate dup;
  ON_SimpleArray<VertexToDuplicate> dups_array;

  const unsigned int subd_vertex_count = level.m_vertex_count;

  unsigned int mesh_ngon_count = 0;
  unsigned int mesh_face_count = 0;
  unsigned int max_ngon_Vcount = 0;
  for (const ON_SubDFace* face = level.m_face[0]; nullptr != face; face = face->m_next_face)
  {
    if ( face->m_edge_count < 2 )
      continue;
    if (face->m_edge_count <= 4)
    {
      mesh_face_count++;
      continue;
    }
    mesh_ngon_count++;
    mesh_face_count += face->m_edge_count;
    if ( max_ngon_Vcount < face->m_edge_count )
      max_ngon_Vcount = face->m_edge_count;
  }

  if (subd_vertex_count < 3 || mesh_face_count < 1 )
    return ON_SUBD_RETURN_ERROR(false);

  const size_t D_initial_capacity = subd_vertex_count + mesh_ngon_count;
  ON_3dPointArray& D = mesh.DoublePrecisionVertices();
  D.Reserve(D_initial_capacity);
  D.SetCount(0);
  ON_SimpleArray<bool> mesh_VertexNeedsDuplicated(D_initial_capacity);

  mesh.m_F.Reserve(mesh_face_count);
  mesh.m_F.SetCount(0);

  ON_SimpleArray< ON_2udex > ngon_spans(mesh_ngon_count);

  bool rc = false;
  for (;;)
  {
    // must iterate vertices in order of increasing id
    for (const ON_SubDVertex* vertex = vit_by_id.FirstVertex(); nullptr != vertex; vertex = vit_by_id.NextVertex())
    {
      unsigned int vi = vertex->ArchiveId();
      if (vi < 1 || vi > subd_vertex_count)
        break;
      if (D.UnsignedCount()+1 != vi)
        break;
      D.AppendNew() = vertex->m_P;
      mesh_VertexNeedsDuplicated.AppendNew() = VertexToDuplicate::NeedsDuplicated(vertex);
    }

    if (D.UnsignedCount() != subd_vertex_count)
      break;

    ngon_spans.Reserve(mesh_ngon_count);
    unsigned int max_ngon_face_count = 0;
    mesh_face_count = 0;
    // must iterate faces in order of increasing id
    for (const ON_SubDFace* face = fit_by_id.FirstFace(); nullptr != face; face = fit_by_id.NextFace())
    {
      ON_MeshFace meshf = {};
      
      if (face->m_edge_count <= 4)
      {
        // SubD quad face or 3-gon face gets a single ON_Mesh face
        if (face->m_edge_count < 3)
          continue;

        //const bool bQuad = 4 == face->m_edge_count;

        for (unsigned short fvi = 0; fvi < face->m_edge_count; fvi++)
        {
          const ON_SubDVertex* vertex = face->Vertex(fvi);
          meshf.vi[fvi] = (int)((nullptr != vertex) ? vertex->ArchiveId() : 0U);
          if (meshf.vi[fvi] < 1 || meshf.vi[fvi] > (int)subd_vertex_count)
          {
            meshf.vi[0] = -1;
            break;
          }
          meshf.vi[fvi]--;
          if (mesh_VertexNeedsDuplicated[meshf.vi[fvi]])
          {
            dup.m_vertex = vertex;
            dup.m_face = face;
            dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
            dup.m_mesh_V_index = meshf.vi[fvi];
            dups_array.Append(dup);
          }
        }
        if (-1 == meshf.vi[0] )
          continue;
        if ( 3 == face->m_edge_count)
          meshf.vi[3] = meshf.vi[2];
        mesh.m_F.Append(meshf);
        continue;
      }
      else // face->m_edge_count >= 5
      {
        // SubD n-gon face with n >= 5 gets n ON_Mesh triangles grouped into
        ON_3dPoint center_point;
        if (false == face->GetSubdivisionPoint( center_point))
          continue;

        ON_2udex ngon_span = { mesh.m_F.UnsignedCount(), 0 };

        const unsigned int dup_count0 = dups_array.UnsignedCount();

        const unsigned int Dcount0 = D.UnsignedCount();
        const unsigned int Fcount0 = mesh.m_F.UnsignedCount();
        meshf.vi[2] = (int)Dcount0;
        meshf.vi[3] = meshf.vi[2];

        const ON_SubDVertex* vertex = face->Vertex(0);
        meshf.vi[1] = (nullptr != vertex) ? vertex->ArchiveId() : 0;
        if (meshf.vi[1] < 1 || meshf.vi[1] > (int)subd_vertex_count)
          continue;
        meshf.vi[1]--;

        if (mesh_VertexNeedsDuplicated[meshf.vi[1]])
        {
          dup.m_vertex = vertex;
          dup.m_face = face;
          dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
          dup.m_mesh_V_index = meshf.vi[1];
          dups_array.Append(dup);
        }

        mesh_VertexNeedsDuplicated.Append(false);
        D.Append(center_point);

        for (unsigned short fvi = 1; fvi <= face->m_edge_count; fvi++)
        {
          meshf.vi[0] = meshf.vi[1];
          vertex = face->Vertex(fvi % face->m_edge_count);
          meshf.vi[1] = (int)((nullptr != vertex) ? vertex->ArchiveId() : 0U);
          if (meshf.vi[1] < 1 || meshf.vi[1] > (int)subd_vertex_count)
          {
            meshf.vi[0] = -1;
            break;
          }
          meshf.vi[1]--;

          if (fvi < face->m_edge_count)
          {
            if (mesh_VertexNeedsDuplicated[meshf.vi[1]])
            {
              dup.m_vertex = vertex;
              dup.m_face = face;
              dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
              dup.m_mesh_V_index = meshf.vi[1];
              dups_array.Append(dup);
            }
          }

          mesh.m_F.Append(meshf);
        }
        ngon_span.j = mesh.m_F.UnsignedCount();

        unsigned int ngon_face_count = ngon_span.j - ngon_span.i;
        if ( -1 == meshf.vi[0] || ngon_face_count != face->EdgeCount() )
        {
          D.SetCount(Dcount0);
          mesh.m_F.SetCount(Fcount0);
          dups_array.SetCount(dup_count0);
          continue;
        }
        ngon_span.j = mesh.m_F.UnsignedCount();
        if (ngon_face_count >= 3)
        {
          ngon_spans.Append(ngon_span);
          if ( ngon_face_count > max_ngon_face_count)
            max_ngon_face_count = ngon_face_count;
        }
      }
    }

    if (mesh.m_F.UnsignedCount() <= 0)
      break;

    rc = true;
    break;
  }

  level.ClearArchiveId();
  if (false == rc )
    return ON_SUBD_RETURN_ERROR(false);

  if (D.UnsignedCount() < 3 || mesh.m_F.UnsignedCount() < 1)
    return ON_SUBD_RETURN_ERROR(false);

  Internal_DuplicateVertices( mesh, D, dups_array);

  // group all mesh faces that came from the same level zero subd face into an ngon.
  if (ngon_spans.UnsignedCount() > 0 && max_ngon_Vcount >= 3)
  {
    ON_SimpleArray< unsigned int> ngon_buffer;
    unsigned int* ngon_fi = ngon_buffer.Reserve(2*max_ngon_Vcount);
    unsigned int* ngon_vi = ngon_fi + max_ngon_Vcount;
    for (unsigned int ngon_dex = 0; ngon_dex < ngon_spans.UnsignedCount(); ngon_dex++ )
    {
      ON_2udex ngon_span = ngon_spans[ngon_dex];
      unsigned int Fcount = ngon_span.j-ngon_span.i;
      if ( Fcount < 3)
        continue;

      ngon_fi[0] = ngon_span.i;
      ngon_fi[0] = (unsigned int)mesh.m_F[ngon_fi[0]].vi[0];

      unsigned int ngon_Vcount = 0;
      for (unsigned int i = ngon_span.i; i < ngon_span.j; i++)
      {
        ngon_fi[ngon_Vcount] = i;
        ngon_vi[ngon_Vcount] = (unsigned int)(mesh.m_F[i].vi[0]);
        ngon_Vcount++;
      }
      mesh.AddNgon(ngon_Vcount, ngon_vi, ngon_Vcount, ngon_fi );
    }
  }

  return true;
}